

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_initialize_event.cpp
# Opt level: O2

void __thiscall duckdb::PipelineInitializeEvent::Schedule(PipelineInitializeEvent *this)

{
  type args;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  _Head_base<0UL,_duckdb::PipelineInitializeTask_*,_false> local_70;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_68;
  enable_shared_from_this<duckdb::Event> local_48;
  shared_ptr<duckdb::Task,_true> local_38;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_28;
  
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args = shared_ptr<duckdb::Pipeline,_true>::operator*(&(this->super_BasePipelineEvent).pipeline);
  enable_shared_from_this<duckdb::Event>::shared_from_this(&local_48);
  make_uniq<duckdb::PipelineInitializeTask,duckdb::Pipeline&,duckdb::shared_ptr<duckdb::Event,true>>
            ((duckdb *)&local_70,args,(shared_ptr<duckdb::Event,_true> *)&local_48);
  shared_ptr<duckdb::Task,_true>::
  shared_ptr<duckdb::PipelineInitializeTask,_std::default_delete<duckdb::PipelineInitializeTask>,_true,_0>
            (&local_38,
             (unique_ptr<duckdb::PipelineInitializeTask,_std::default_delete<duckdb::PipelineInitializeTask>,_true>
              *)&local_70);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
            ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
              *)&local_68,&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (local_70._M_head_impl != (PipelineInitializeTask *)0x0) {
    (*((local_70._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
  }
  local_70._M_head_impl = (PipelineInitializeTask *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.__weak_this_.internal.
              super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_28.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_28);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_28);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void PipelineInitializeEvent::Schedule() {
	// needs to spawn a task to get the chain of tasks for the query plan going
	vector<shared_ptr<Task>> tasks;
	tasks.push_back(make_uniq<PipelineInitializeTask>(*pipeline, shared_from_this()));
	SetTasks(std::move(tasks));
}